

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexPattern.cpp
# Opt level: O0

void UnifiedRegex::RegexPattern::TraceTestCache
               (bool cacheHit,JavascriptString *input,JavascriptString *cachedValue,bool disabled)

{
  char16 *pcVar1;
  bool disabled_local;
  JavascriptString *cachedValue_local;
  JavascriptString *input_local;
  bool cacheHit_local;
  
  if ((DAT_01ec73d8 & 1) != 0) {
    if (disabled) {
      Output::Print(L"Regexp Test Cache Disabled.\n");
    }
    else if (cacheHit) {
      Output::Print(L"Regexp Test Cache Hit.\n");
    }
    else {
      Output::Print(L"Regexp Test Cache Miss. ");
      if (cachedValue == (JavascriptString *)0x0) {
        Output::Print(L"Cache was empty\n");
      }
      else {
        pcVar1 = Js::JavascriptString::GetString(cachedValue);
        Output::Print(L"Input: (%p); Cached String: (%p) \'%s\'\n",input,cachedValue,pcVar1);
      }
    }
  }
  return;
}

Assistant:

void RegexPattern::TraceTestCache(bool cacheHit, Js::JavascriptString* input, Js::JavascriptString* cachedValue, bool disabled)
    {
        if (REGEX_CONFIG_FLAG(RegexTracing))
        {
            if (disabled)
            {
                Output::Print(_u("Regexp Test Cache Disabled.\n"));
            }
            else if (cacheHit)
            {
                Output::Print(_u("Regexp Test Cache Hit.\n"));
            }
            else
            {
                Output::Print(_u("Regexp Test Cache Miss. "));
                if (cachedValue != nullptr)
                {
                    Output::Print(_u("Input: (%p); Cached String: (%p) '%s'\n"), input, cachedValue, cachedValue->GetString());
                }
                else
                {
                    Output::Print(_u("Cache was empty\n"));
                }
            }
        }
    }